

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

uint __thiscall
boost::runtime::value_interpreter<unsigned_int,_false>::interpret
          (value_interpreter<unsigned_int,_false> *this,cstring *param_name,cstring *source)

{
  bool bVar1;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  uint *in_stack_00000048;
  const_string *in_stack_00000050;
  uint res;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> *in_stack_fffffffffffffec0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
  *in_stack_fffffffffffffec8;
  basic_cstring<const_char> local_30;
  uint local_1c;
  
  unit_test::basic_cstring<const_char>::basic_cstring(&local_30,in_RDX);
  bVar1 = unit_test::utils::string_as<unsigned_int>(in_stack_00000050,in_stack_00000048);
  if (!bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(&local_158,in_RSI);
    format_error::format_error((format_error *)in_RDX,(cstring *)&stack0xfffffffffffffeb8);
    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
              ((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
               in_RSI,(char *)in_RDX);
    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
              ((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
               in_RSI,(char *)in_RDX);
    unit_test::ut_detail::throw_exception<boost::runtime::format_error>((format_error *)in_RDX);
  }
  return local_1c;
}

Assistant:

ValueType interpret( cstring param_name, cstring source ) const
    {
        ValueType res;
        if( !unit_test::utils::string_as<ValueType>( source, res ) )
            BOOST_TEST_I_THROW( format_error( param_name ) << source <<
                                " can't be interpreted as value of parameter " << param_name << "." );
        return res;
    }